

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
               (NodeTranslator *location,Node *params,ErrorReporter *params_1,Reader *params_2,
               Orphan<capnp::schema::Node> *params_3,bool *params_4)

{
  OrphanBuilder local_28;
  
  local_28.segment = (params_3->builder).segment;
  local_28.capTable = (params_3->builder).capTable;
  local_28.location = (params_3->builder).location;
  local_28.tag.content = (params_3->builder).tag.content;
  (params_3->builder).segment = (SegmentBuilder *)0x0;
  (params_3->builder).location = (word *)0x0;
  capnp::compiler::NodeTranslator::NodeTranslator
            (location,&params->super_Resolver,params_1,params_2,
             (Orphan<capnp::schema::Node> *)&local_28,*params_4);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_28);
  return;
}

Assistant:

inline NullableValue& operator=(const NullableValue<U&>& other) {
    if (other.isSet) {
      emplace(other.value);
    } else {
      *this = nullptr;
    }
    return *this;
  }